

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::MultiThreadedObjectTest::querySetSharedObjects
          (MultiThreadedObjectTest *this,TestThread *thread,int count)

{
  uint uVar1;
  void *pvVar2;
  Type TVar3;
  int iVar4;
  deUint32 dVar5;
  ThreadLog *pTVar6;
  void **ppvVar7;
  pointer ppVar8;
  EndMessageToken *pEVar9;
  deRandom *rnd;
  bool bVar10;
  EGLint value;
  TestThread *local_60;
  Library *local_58;
  EGLDisplay *local_50;
  vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  objectTypes;
  
  local_58 = MultiThreadedTest::getLibrary(&this->super_MultiThreadedTest);
  iVar4 = thread->m_id;
  objectTypes.
  super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objectTypes.
  super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objectTypes.
  super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  TVar3 = this->m_types;
  local_60 = thread;
  if ((TVar3 & TYPE_PBUFFER) != 0) {
    value = 1;
    std::
    vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
    ::emplace_back<deqp::egl::MultiThreadedObjectTest::Type>(&objectTypes,(Type *)&value);
    TVar3 = this->m_types;
  }
  if ((TVar3 & TYPE_PIXMAP) != 0) {
    value = 2;
    std::
    vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
    ::emplace_back<deqp::egl::MultiThreadedObjectTest::Type>(&objectTypes,(Type *)&value);
    TVar3 = this->m_types;
  }
  if (((this->m_sharedNativeWindows).
       super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->m_sharedNativeWindows).
       super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && ((TVar3 & TYPE_WINDOW) != 0)) {
    value = 4;
    std::
    vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
    ::emplace_back<deqp::egl::MultiThreadedObjectTest::Type>(&objectTypes,(Type *)&value);
    TVar3 = this->m_types;
  }
  if ((TVar3 & TYPE_CONTEXT) != 0) {
    value = 0x10;
    std::
    vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
    ::emplace_back<deqp::egl::MultiThreadedObjectTest::Type>(&objectTypes,(Type *)&value);
  }
  rnd = &(&this->m_rnd0)[iVar4 != 0].m_rnd;
  local_60 = (TestThread *)&local_60->m_log;
  if (count < 1) {
    count = 0;
  }
  local_50 = &(this->super_MultiThreadedTest).m_display;
LAB_00dc0af8:
  do {
    bVar10 = count == 0;
    count = count + -1;
    if (bVar10) {
      std::
      _Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
      ::~_Vector_base(&objectTypes.
                       super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                     );
      return;
    }
    TVar3 = de::Random::
            choose<deqp::egl::MultiThreadedObjectTest::Type,__gnu_cxx::__normal_iterator<deqp::egl::MultiThreadedObjectTest::Type*,std::vector<deqp::egl::MultiThreadedObjectTest::Type,std::allocator<deqp::egl::MultiThreadedObjectTest::Type>>>>
                      ((Random *)rnd,
                       (__normal_iterator<deqp::egl::MultiThreadedObjectTest::Type_*,_std::vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>_>
                        )objectTypes.
                         super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<deqp::egl::MultiThreadedObjectTest::Type_*,_std::vector<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>_>
                        )objectTypes.
                         super__Vector_base<deqp::egl::MultiThreadedObjectTest::Type,_std::allocator<deqp::egl::MultiThreadedObjectTest::Type>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    if (TVar3 == TYPE_PBUFFER) {
      iVar4 = de::Random::getInt((Random *)rnd,0,
                                 (int)((ulong)((long)(this->m_sharedPbuffers).
                                                                                                          
                                                  super__Vector_base<void_*,_std::allocator<void_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this->m_sharedPbuffers).
                                                                                                        
                                                  super__Vector_base<void_*,_std::allocator<void_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                 -1);
      ppvVar7 = (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start + iVar4;
    }
    else {
      if (TVar3 == TYPE_PIXMAP) {
        iVar4 = de::Random::getInt((Random *)rnd,0,
                                   (int)((ulong)((long)(this->m_sharedNativePixmaps).
                                                                                                              
                                                  super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->m_sharedNativePixmaps).
                                                                                                            
                                                  super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) +
                                   -1);
        ppVar8 = (pointer)(this->m_sharedNativePixmaps).
                          super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        if (TVar3 != TYPE_WINDOW) {
          if (TVar3 == TYPE_CONTEXT) {
            iVar4 = de::Random::getInt((Random *)rnd,0,
                                       (int)((ulong)((long)(this->m_sharedContexts).
                                                                                                                      
                                                  super__Vector_base<void_*,_std::allocator<void_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->m_sharedContexts).
                                                                                                                
                                                  super__Vector_base<void_*,_std::allocator<void_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                       -1);
            pvVar2 = (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar4];
            if (pvVar2 != (void *)0x0) {
              dVar5 = deRandom_getUint32(rnd);
              uVar1 = querySetSharedObjects::attributes[dVar5 & 3];
              (*local_58->_vptr_Library[0x29])(local_58,*local_50,pvVar2,(ulong)uVar1,&value);
              std::ostream::_M_insert<unsigned_long>((ulong)local_60);
              std::operator<<((ostream *)local_60," = eglQueryContext(");
              pTVar6 = ThreadLog::operator<<((ThreadLog *)local_60,local_50);
              std::operator<<((ostream *)pTVar6,", ");
              std::ostream::_M_insert<void_const*>(pTVar6);
              std::operator<<((ostream *)pTVar6,", ");
              std::ostream::operator<<(pTVar6,uVar1);
              std::operator<<((ostream *)pTVar6,", ");
              std::ostream::operator<<(pTVar6,value);
              pEVar9 = (EndMessageToken *)0x17263e7;
              std::operator<<((ostream *)pTVar6,")");
              ThreadLog::operator<<(pTVar6,pEVar9);
              dVar5 = (*local_58->_vptr_Library[0x1f])();
              eglu::checkError(dVar5,"eglQueryContext()",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                               ,0x591);
            }
          }
          goto LAB_00dc0af8;
        }
        iVar4 = de::Random::getInt((Random *)rnd,0,
                                   (int)((ulong)((long)(this->m_sharedNativeWindows).
                                                                                                              
                                                  super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->m_sharedNativeWindows).
                                                                                                            
                                                  super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) +
                                   -1);
        ppVar8 = (this->m_sharedNativeWindows).
                 super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      ppvVar7 = &ppVar8[iVar4].second;
    }
    pvVar2 = *ppvVar7;
    if (pvVar2 != (void *)0x0) {
      dVar5 = deRandom_getUint32(rnd);
      uVar1 = querySetSharedObjects::queryAttributes[(ulong)dVar5 % 3];
      (*local_58->_vptr_Library[0x2b])(local_58,*local_50,pvVar2,(ulong)uVar1,&value);
      std::ostream::_M_insert<unsigned_long>((ulong)local_60);
      std::operator<<((ostream *)local_60," = eglQuerySurface(");
      pTVar6 = ThreadLog::operator<<((ThreadLog *)local_60,local_50);
      std::operator<<((ostream *)pTVar6,", ");
      std::ostream::_M_insert<void_const*>(pTVar6);
      std::operator<<((ostream *)pTVar6,", ");
      std::ostream::operator<<(pTVar6,uVar1);
      std::operator<<((ostream *)pTVar6,", ");
      std::ostream::operator<<(pTVar6,value);
      pEVar9 = (EndMessageToken *)0x17263e7;
      std::operator<<((ostream *)pTVar6,")");
      ThreadLog::operator<<(pTVar6,pEVar9);
      dVar5 = (*local_58->_vptr_Library[0x1f])();
      eglu::checkError(dVar5,"eglQuerySurface()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x57e);
    }
  } while( true );
}

Assistant:

void MultiThreadedObjectTest::querySetSharedObjects (TestThread& thread, int count)
{
	const Library&		egl		= getLibrary();
	de::Random&			rnd		= (thread.getId() == 0 ? m_rnd0 : m_rnd1);
	vector<Type>		objectTypes;

	if ((m_types & TYPE_PBUFFER) != 0)
		objectTypes.push_back(TYPE_PBUFFER);

	if ((m_types & TYPE_PIXMAP) != 0)
		objectTypes.push_back(TYPE_PIXMAP);

	if (!m_sharedNativeWindows.empty() && (m_types & TYPE_WINDOW) != 0)
		objectTypes.push_back(TYPE_WINDOW);

	if ((m_types & TYPE_CONTEXT) != 0)
		objectTypes.push_back(TYPE_CONTEXT);

	for (int queryNdx = 0; queryNdx < count; queryNdx++)
	{
		const Type	type		= rnd.choose<Type>(objectTypes.begin(), objectTypes.end());
		EGLSurface	surface		= EGL_NO_SURFACE;
		EGLContext	context		= EGL_NO_CONTEXT;

		switch (type)
		{
			case TYPE_PBUFFER:
				surface = m_sharedPbuffers[rnd.getInt(0, (int)(m_sharedPbuffers.size()-1))];
				break;

			case TYPE_PIXMAP:
				surface = m_sharedNativePixmaps[rnd.getInt(0, (int)(m_sharedNativePixmaps.size()-1))].second;
				break;

			case TYPE_WINDOW:
				surface = m_sharedNativeWindows[rnd.getInt(0, (int)(m_sharedNativeWindows.size()-1))].second;
				break;

			case TYPE_CONTEXT:
				context = m_sharedContexts[rnd.getInt(0, (int)(m_sharedContexts.size()-1))];
				break;

			default:
				DE_ASSERT(false);
		}

		if (surface != EGL_NO_SURFACE)
		{
			static const EGLint queryAttributes[] =
			{
				EGL_LARGEST_PBUFFER,
				EGL_HEIGHT,
				EGL_WIDTH
			};

			const EGLint	attribute	= queryAttributes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(queryAttributes) - 1)];
			EGLBoolean		result;
			EGLint			value;

			result = egl.querySurface(m_display, surface, attribute, &value);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglQuerySurface(" << m_display << ", " << surface << ", " << attribute << ", " << value << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglQuerySurface()");

		}
		else if (context != EGL_NO_CONTEXT)
		{
			static const EGLint attributes[] =
			{
				EGL_CONFIG_ID,
				EGL_CONTEXT_CLIENT_TYPE,
				EGL_CONTEXT_CLIENT_VERSION,
				EGL_RENDER_BUFFER
			};

			const EGLint	attribute = attributes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(attributes)-1)];
			EGLint			value;
			EGLBoolean		result;

			result = egl.queryContext(m_display, context, attribute, &value);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglQueryContext(" << m_display << ", " << context << ", " << attribute << ", " << value << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglQueryContext()");

		}
		else
			DE_ASSERT(false);
	}
}